

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

bool __thiscall
flatbuffers::cpp::CppGenerator::NeedsCopyCtorAssignOp(CppGenerator *this,StructDef *struct_def)

{
  BaseType BVar1;
  pointer ppFVar2;
  FieldDef *pFVar3;
  FieldDef *pFVar4;
  bool bVar5;
  Value *pVVar6;
  Value *pVVar7;
  pointer ppFVar8;
  allocator<char> local_51;
  string local_50;
  
  ppFVar8 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppFVar2 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppFVar8 == ppFVar2) {
LAB_0016ac35:
      return ppFVar8 != ppFVar2;
    }
    pFVar3 = *ppFVar8;
    if (pFVar3->deprecated == false) {
      BVar1 = (pFVar3->value).type.base_type;
      if ((BVar1 == BASE_TYPE_VECTOR) || (BVar1 == BASE_TYPE_VECTOR64)) {
        if ((pFVar3->value).type.element != BASE_TYPE_UTYPE) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"cpp_type",&local_51);
          pVVar6 = SymbolTable<flatbuffers::Value>::Lookup
                             (&(pFVar3->super_Definition).attributes,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          pFVar3 = *ppFVar8;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"cpp_ptr_type",&local_51);
          pVVar7 = SymbolTable<flatbuffers::Value>::Lookup
                             (&(pFVar3->super_Definition).attributes,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          bVar5 = IsVectorOfPointers(*ppFVar8);
          if (!bVar5) goto LAB_0016ac10;
          goto LAB_0016ac35;
        }
      }
      else if (BVar1 == BASE_TYPE_STRUCT) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"cpp_type",&local_51)
        ;
        pVVar6 = SymbolTable<flatbuffers::Value>::Lookup
                           (&(pFVar3->super_Definition).attributes,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        pFVar4 = *ppFVar8;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"cpp_ptr_type",&local_51);
        pVVar7 = SymbolTable<flatbuffers::Value>::Lookup
                           (&(pFVar4->super_Definition).attributes,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        if ((((pFVar3->value).type.base_type != BASE_TYPE_STRUCT) ||
            (((pFVar3->value).type.struct_def)->fixed != true)) ||
           ((*ppFVar8)->native_inline != true)) goto LAB_0016ac35;
LAB_0016ac10:
        if ((pVVar6 != (Value *)0x0) && (bVar5 = std::operator!=(&pVVar7->constant,"naked"), bVar5))
        goto LAB_0016ac35;
      }
    }
    ppFVar8 = ppFVar8 + 1;
  } while( true );
}

Assistant:

std::string GenEnumValDecl(const EnumDef &enum_def,
                             const std::string &enum_val) const {
    return opts_.prefixed_enums ? Name(enum_def) + "_" + enum_val : enum_val;
  }